

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Instructions.cc
# Opt level: O2

string * __thiscall
flow::CastInstr::to_string_abi_cxx11_(string *__return_storage_ptr__,CastInstr *this)

{
  LiteralType *in_R8;
  string_view format_str;
  LiteralType local_3c;
  string local_38;
  
  local_3c = (this->super_Instr).super_Value.type_;
  format_str.size_ = (size_t)&local_3c;
  format_str.data_ = (char *)0x7;
  fmt::v5::format<flow::LiteralType>(&local_38,(v5 *)"cast {}",format_str,in_R8);
  Instr::formatOne(__return_storage_ptr__,&this->super_Instr,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  return __return_storage_ptr__;
}

Assistant:

std::string CastInstr::to_string() const {
  return formatOne(fmt::format("cast {}", type()));
}